

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

_Bool Previous_Choice(FIELDTYPE *typ,FIELD *field,TypeArgument *argp)

{
  _Bool _Var1;
  
  if (typ != (FIELDTYPE *)0x0) {
    do {
      if ((typ->status & 4) == 0) {
        return false;
      }
      if ((typ->status & 1) == 0) {
        if (typ->prev == (_func__Bool_FIELD_ptr_void_ptr *)0x0) {
          __assert_fail("typ->prev != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CursesDialog/form/frm_driver.c"
                        ,0xa3e,"_Bool Previous_Choice(FIELDTYPE *, FIELD *, TypeArgument *)");
        }
        _Var1 = (*typ->prev)(field,argp);
        return _Var1;
      }
      if (argp == (TypeArgument *)0x0) {
        __assert_fail("argp != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CursesDialog/form/frm_driver.c"
                      ,0xa37,"_Bool Previous_Choice(FIELDTYPE *, FIELD *, TypeArgument *)");
      }
      _Var1 = Previous_Choice(typ->left,field,argp->left);
      if (_Var1) {
        return true;
      }
      typ = typ->right;
      argp = argp->right;
    } while (typ != (typenode *)0x0);
  }
  return false;
}

Assistant:

static bool Previous_Choice(FIELDTYPE *typ, FIELD *field, TypeArgument *argp)
{
  if (!typ || !(typ->status & _HAS_CHOICE)) 
    return FALSE;

  if (typ->status & _LINKED_TYPE)
    {
      assert(argp != 0);
      return(
             Previous_Choice(typ->left ,field,argp->left) ||
             Previous_Choice(typ->right,field,argp->right));
    } 
  else 
    {
      assert(typ->prev != 0);
      return typ->prev(field,(void *)argp);
    }
}